

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

void Prs_ManWriteVerilogArray(FILE *pFile,Prs_Ntk_t *p,Vec_Int_t *vSigs,int fOdd)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  uint i;
  
  iVar3 = vSigs->nSize;
  if (0 < iVar3) {
    bVar1 = true;
    for (i = 0; (int)i < iVar3; i = i + 1) {
      iVar3 = Vec_IntEntry(vSigs,i);
      if (fOdd == 0 || (i & 1) != 0) {
        pcVar2 = "T = %d\t\t";
        if (!bVar1) {
          pcVar2 = "    \"%s\", ";
        }
        fputs(pcVar2 + 8,(FILE *)pFile);
        Prs_ManWriteVerilogSignal(pFile,p,iVar3);
        bVar1 = false;
      }
      iVar3 = vSigs->nSize;
    }
    return;
  }
  __assert_fail("Vec_IntSize(vSigs) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                ,0xc2,"void Prs_ManWriteVerilogArray(FILE *, Prs_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

void Prs_ManWriteVerilogArray( FILE * pFile, Prs_Ntk_t * p, Vec_Int_t * vSigs, int fOdd )
{
    int i, Sig, fFirst = 1;
    assert( Vec_IntSize(vSigs) > 0 );
    Vec_IntForEachEntry( vSigs, Sig, i )
    {
        if ( fOdd && !(i & 1) )
            continue;
        fprintf( pFile, "%s", fFirst ? "" : ", " );
        Prs_ManWriteVerilogSignal( pFile, p, Sig );
        fFirst = 0;
    }
}